

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

int __thiscall StringType::StaticSize(StringType *this,Env *env)

{
  long in_RDI;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x18c) == 0) {
    ConstString::unescaped_abi_cxx11_(*(ConstString **)(in_RDI + 400));
    local_4 = std::__cxx11::string::length();
  }
  else if (*(int *)(in_RDI + 0x18c) - 1U < 2) {
    local_4 = -1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int StringType::StaticSize(Env* env) const
	{
	switch ( type_ )
		{
		case CSTR:
			// Use length of the unescaped string
			return str_->unescaped().length();
		case REGEX:
			// TODO: static size for a regular expression?
		case ANYSTR:
			return -1;

		default:
			ASSERT(0);
			return -1;
		}
	}